

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallDirectoryGenerator::GenerateScriptForConfig
          (cmInstallDirectoryGenerator *this,ostream *os,string *config,Indent indent)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  string *d;
  pointer in_name;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_98;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  size_type local_68;
  pointer local_60;
  undefined8 local_58;
  string local_50;
  
  GetDirectories(&local_b0,this,config);
  if (local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = this->LocalGenerator->Makefile;
    in_name = local_b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
      if (!bVar1) {
        psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
        local_98.first._M_str = (psVar2->_M_dataplus)._M_p;
        local_98.first._M_len = psVar2->_M_string_length;
        local_98.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_80 = 1;
        local_78 = "/";
        local_70 = 0;
        local_60 = (in_name->_M_dataplus)._M_p;
        local_68 = in_name->_M_string_length;
        local_58 = 0;
        views._M_len = 3;
        views._M_array = &local_98;
        cmCatViews(&local_50,views);
        std::__cxx11::string::operator=((string *)in_name,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      in_name = in_name + 1;
    } while (in_name !=
             local_b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  AddDirectoryInstallRule(this,os,config,indent,&local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  return;
}

Assistant:

void cmInstallDirectoryGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::vector<std::string> dirs = this->GetDirectories(config);

  // Make sure all dirs have absolute paths.
  cmMakefile const& mf = *this->LocalGenerator->GetMakefile();
  for (std::string& d : dirs) {
    if (!cmSystemTools::FileIsFullPath(d)) {
      d = cmStrCat(mf.GetCurrentSourceDirectory(), "/", d);
    }
  }

  this->AddDirectoryInstallRule(os, config, indent, dirs);
}